

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZEqnArray<float>_*>::TPZVec
          (TPZVec<TPZEqnArray<float>_*> *this,TPZVec<TPZEqnArray<float>_*> *copy)

{
  ulong uVar1;
  TPZEqnArray<float> **ppTVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_017d70a8;
  this->fStore = (TPZEqnArray<float> **)0x0;
  uVar1 = copy->fNElements;
  if ((long)uVar1 < 1) {
    ppTVar2 = (TPZEqnArray<float> **)0x0;
  }
  else {
    ppTVar2 = (TPZEqnArray<float> **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
  }
  this->fStore = ppTVar2;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (long)uVar1) {
    uVar4 = uVar1;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    this->fStore[uVar3] = copy->fStore[uVar3];
  }
  this->fNElements = uVar1;
  this->fNAlloc = copy->fNAlloc;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const TPZVec<T> &copy){
	fStore = nullptr;
	
	if( copy.fNElements > 0 )
		fStore = new T[copy.fNElements];
	else
		fStore = nullptr;
	
	for(int64_t i=0; i<copy.fNElements; i++)
		fStore[i]=copy.fStore[i];
	
	fNElements = copy.fNElements;
    fNAlloc = copy.fNAlloc;
}